

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O2

err_t RenderBlockData(matroska_block *Element,stream *Output,bool_t bForceWithoutMandatory,
                     bool_t bWithDefault,int ForProfile,filepos_t *Rendered)

{
  ushort uVar1;
  ebml_master *peVar2;
  void *pvVar3;
  stream *psVar4;
  char cVar5;
  byte bVar6;
  int iVar7;
  ebml_context *peVar8;
  bool_t bVar9;
  long lVar10;
  ebml_master *peVar11;
  char *__ptr;
  ulong uVar12;
  ebml_integer *peVar13;
  ebml_context *peVar14;
  size_t sVar15;
  filepos_t fVar16;
  filepos_t fVar17;
  err_t eVar18;
  int *piVar19;
  err_t eVar20;
  int64_t iVar21;
  ulong uVar22;
  uint8_t *Cursor;
  int *piVar23;
  ulong uVar24;
  ushort *puVar26;
  size_t sStack_a0;
  size_t Written;
  stream *local_90;
  ulong local_88;
  int64_t local_80;
  undefined8 local_78;
  long *local_70;
  ebml_integer *local_68;
  uint8_t BlockHead [5];
  size_t local_58;
  uint8_t *OutBuf;
  array local_48;
  matroska_block *local_38;
  ulong uVar25;
  
  cVar5 = Element->Lacing;
  if (cVar5 == '\x04') {
    __assert_fail("Element->Lacing != LACING_AUTO",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x6a7,
                  "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                 );
  }
  uVar1 = Element->TrackNumber;
  if (uVar1 < 0x80) {
    puVar26 = (ushort *)(BlockHead + 1);
    BlockHead[0] = (byte)uVar1 | 0x80;
    sStack_a0 = 4;
  }
  else {
    if (0x3fff < uVar1) {
      return -3;
    }
    puVar26 = (ushort *)(BlockHead + 2);
    BlockHead[0] = (byte)(uVar1 >> 8) | 0x40;
    sStack_a0 = 5;
    BlockHead[1] = (byte)uVar1;
  }
  *puVar26 = Element->LocalTimestamp << 8 | (ushort)Element->LocalTimestamp >> 8;
  *(char *)(puVar26 + 1) = cVar5 * '\x02' | (Element->Invisible != 0) << 3;
  peVar8 = MATROSKA_getContextSimpleBlock();
  bVar9 = EBML_ElementIsType((ebml_element *)Element,peVar8);
  if (bVar9 != 0) {
    if (Element->IsKeyframe != 0) {
      *(byte *)(puVar26 + 1) = (byte)puVar26[1] | 0x80;
    }
    if (Element->IsDiscardable != 0) {
      *(byte *)(puVar26 + 1) = (byte)puVar26[1] | 1;
    }
  }
  if (Output == (stream *)0x0) {
    __assert_fail("(const void*)(Output)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x6c7,
                  "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                 );
  }
  lVar10 = (**(code **)((long)(Output->Base).VMT + 0x70))(Output,BlockHead,sStack_a0);
  if (lVar10 != 0) {
    return lVar10;
  }
  if (Written != sStack_a0) {
    return -0x16;
  }
  if (Rendered != (filepos_t *)0x0) {
    *Rendered = sStack_a0;
  }
  peVar11 = Element->WriteTrack;
  local_90 = Output;
  if (peVar11 == (ebml_master *)0x0) {
    __assert_fail("Element->WriteTrack!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x6d2,
                  "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                 );
  }
  peVar8 = MATROSKA_getContextContentEncodings();
  peVar11 = (ebml_master *)EBML_MasterFindFirstElt(peVar11,peVar8,0,0,0);
  local_88 = 1;
  local_80 = -1;
  local_70 = Rendered;
  if (peVar11 == (ebml_master *)0x0) {
LAB_0010db61:
    peVar13 = (ebml_integer *)0x0;
    local_78 = 0;
  }
  else {
    peVar8 = MATROSKA_getContextContentEncoding();
    peVar11 = (ebml_master *)EBML_MasterFindFirstElt(peVar11,peVar8,0,0,0);
    if ((peVar11->Base).Base.Children == (nodetree *)0x0) goto LAB_0010db61;
    peVar2 = (ebml_master *)(peVar11->Base).Base.Next;
    if (peVar11 == peVar2) {
      __assert_fail("(nodetree*)(Elt) != ((nodetree*)(Elt))->Next",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x6d9,
                    "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                   );
    }
    if (peVar2 != (ebml_master *)0x0) {
      return -3;
    }
    peVar8 = MATROSKA_getContextContentEncodingScope();
    peVar13 = (ebml_integer *)EBML_MasterFindFirstElt(peVar11,peVar8,0,0,0);
    if (peVar13 == (ebml_integer *)0x0) {
      local_88 = 1;
    }
    else {
      local_88 = EBML_IntegerValue(peVar13);
    }
    peVar8 = MATROSKA_getContextContentCompression();
    peVar11 = (ebml_master *)EBML_MasterFindFirstElt(peVar11,peVar8,0,0,0);
    if (peVar11 == (ebml_master *)0x0) {
      return -3;
    }
    peVar8 = MATROSKA_getContextContentCompAlgo();
    peVar13 = (ebml_integer *)EBML_MasterFindFirstElt(peVar11,peVar8,1,1,ForProfile);
    if (peVar13 == (ebml_integer *)0x0) {
      return -5;
    }
    iVar21 = EBML_IntegerValue(peVar13);
    if ((int)iVar21 == 0) {
      local_78 = CONCAT71((int7)((ulong)iVar21 >> 8),1);
      Output = local_90;
      local_80 = iVar21;
    }
    else {
      if ((int)iVar21 != 3) {
        return -5;
      }
      peVar8 = MATROSKA_getContextContentCompSettings();
      local_78 = 0;
      peVar13 = (ebml_integer *)EBML_MasterFindFirstElt(peVar11,peVar8,0,0,0);
      Rendered = local_70;
      Output = local_90;
      local_80 = 3;
    }
  }
  cVar5 = Element->Lacing;
  if (cVar5 == '\x04') {
    cVar5 = GetBestLacingType(Element,ForProfile);
    Element->Lacing = cVar5;
  }
  local_68 = peVar13;
  if (cVar5 == '\0') goto LAB_0010dd5a;
  uVar25 = (Element->SizeList)._Used;
  __ptr = (char *)malloc((uVar25 & 0xfffffffffffffffc) + 1);
  if (__ptr == (char *)0x0) {
    return -2;
  }
  *__ptr = (char)(uVar25 >> 2) + -1;
  if (cVar5 == '\x03') {
    fVar16 = GetBlockFrameSize(Element,0,&peVar13->Base,(MatroskaTrackEncodingCompAlgo)local_80,
                               (MatroskaContentEncodingScope)local_88);
    bVar6 = EBML_CodedSizeLength((long)(int)fVar16,'\0',1);
    bVar6 = EBML_CodedValueLength((long)(int)fVar16,(ulong)bVar6,(uint8_t *)(__ptr + 1),1);
    uVar24 = (ulong)bVar6 + 1;
    for (uVar22 = 1; uVar25 = (Element->SizeList)._Used, Rendered = local_70,
        uVar22 < (uVar25 >> 2) - 1; uVar22 = uVar22 + 1) {
      fVar17 = GetBlockFrameSize(Element,uVar22,&local_68->Base,
                                 (MatroskaTrackEncodingCompAlgo)local_80,
                                 (MatroskaContentEncodingScope)local_88);
      lVar10 = (long)((int)fVar17 - (int)fVar16);
      bVar6 = EBML_CodedSizeLengthSigned(lVar10,'\0');
      bVar6 = EBML_CodedValueLengthSigned(lVar10,(ulong)bVar6,(uint8_t *)(__ptr + uVar24));
      uVar24 = uVar24 + bVar6;
      fVar16 = fVar17;
    }
LAB_0010dd0d:
    if ((uVar25 & 0xfffffffffffffffc) + 1 < uVar24) {
      __assert_fail("LaceSize <= (1 + ARRAYCOUNT(Element->SizeList,int32_t)*4)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x72a,
                    "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                   );
    }
  }
  else {
    uVar24 = 1;
    if (cVar5 == '\x01') {
      for (uVar22 = 0; uVar22 < (uVar25 >> 2) - 1; uVar22 = uVar22 + 1) {
        uVar12 = GetBlockFrameSize(Element,uVar22,&local_68->Base,
                                   (MatroskaTrackEncodingCompAlgo)local_80,
                                   (MatroskaContentEncodingScope)local_88);
        uVar25 = uVar24;
        while( true ) {
          uVar24 = uVar25 + 1;
          if ((int)uVar12 < 0xff) break;
          __ptr[uVar25] = -1;
          uVar12 = (ulong)((int)uVar12 - 0xff);
          uVar25 = uVar24;
        }
        __ptr[uVar25] = (char)uVar12;
        uVar25 = (Element->SizeList)._Used;
      }
      goto LAB_0010dd0d;
    }
  }
  lVar10 = (**(code **)((long)(local_90->Base).VMT + 0x70))(local_90,__ptr,uVar24,&Written);
  if (lVar10 != 0) {
    return lVar10;
  }
  if (Rendered != (long *)0x0) {
    *Rendered = *Rendered + Written;
  }
  free(__ptr);
  Output = local_90;
LAB_0010dd5a:
  peVar13 = local_68;
  (**(code **)((long)(Element->Base).Base.Base.Base.VMT + 0x20))
            (Element,0x180,&Element->WriteTrack,8);
  Cursor = (uint8_t *)(Element->Data)._Begin;
  if ((peVar13 == (ebml_integer *)0x0) || ((local_88 & 1) == 0)) {
    eVar18 = (**(code **)((long)(Output->Base).VMT + 0x70))
                       (Output,Cursor,(Element->Data)._Used,&Written);
    if (Rendered != (long *)0x0) {
      *Rendered = *Rendered + Written;
    }
  }
  else {
    peVar8 = (peVar13->Base).Context;
    peVar14 = MATROSKA_getContextContentCompAlgo();
    psVar4 = local_90;
    if (peVar8 == peVar14) {
      if ((char)local_78 == '\0') {
        eVar18 = 0;
      }
      else {
        local_48._Begin = (char *)0x0;
        local_48._Used = 0;
        eVar18 = 0;
        piVar19 = (int *)(Element->SizeList)._Begin;
        for (piVar23 = piVar19;
            piVar23 != (int *)(((Element->SizeList)._Used & 0xfffffffffffffffc) + (long)piVar19);
            piVar23 = piVar23 + 1) {
          bVar9 = ArrayResize(&local_48,(long)*piVar23 + 100,0);
          if (bVar9 == 0) {
LAB_0010e060:
            ArrayClear(&local_48);
            return -2;
          }
          OutBuf = (uint8_t *)local_48._Begin;
          local_58 = local_48._Used;
          eVar20 = CompressFrameZLib(Cursor,(long)*piVar23,&OutBuf,&local_58);
          if (eVar20 != 0) goto LAB_0010e060;
          lVar10 = (**(code **)((long)(local_90->Base).VMT + 0x70))
                             (local_90,OutBuf,local_58,&Written);
          ArrayClear(&local_48);
          if (local_70 != (long *)0x0) {
            *local_70 = *local_70 + Written;
          }
          if (lVar10 != 0) {
            return lVar10;
          }
          Cursor = Cursor + *piVar23;
          piVar19 = (int *)(Element->SizeList)._Begin;
        }
      }
    }
    else {
      eVar18 = 0;
      piVar19 = (int *)(Element->SizeList)._Begin;
      local_38 = Element;
      for (piVar23 = piVar19; peVar13 = local_68,
          piVar23 != (int *)(((local_38->SizeList)._Used & 0xfffffffffffffffc) + (long)piVar19);
          piVar23 = piVar23 + 1) {
        pvVar3 = (void *)local_68->Value;
        sVar15 = EBML_ElementDataSize(&local_68->Base,1);
        iVar7 = bcmp(Cursor,pvVar3,sVar15);
        if (iVar7 != 0) {
          __assert_fail("memcmp(Cursor,ARRAYBEGIN(((ebml_binary*)Header)->Data,uint8_t),(size_t)EBML_ElementDataSize(Header, 1))==0"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x761,
                        "err_t RenderBlockData(matroska_block *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                       );
        }
        pvVar3 = (void *)peVar13->Value;
        sVar15 = EBML_ElementDataSize(&peVar13->Base,1);
        iVar7 = bcmp(Cursor,pvVar3,sVar15);
        if (iVar7 != 0) {
          return -3;
        }
        fVar16 = EBML_ElementDataSize(&peVar13->Base,1);
        iVar7 = *piVar23;
        fVar17 = EBML_ElementDataSize(&peVar13->Base,1);
        local_58 = iVar7 - fVar17;
        eVar18 = (**(code **)((long)(psVar4->Base).VMT + 0x70))
                           (psVar4,Cursor + fVar16,local_58,&Written);
        if (local_70 != (long *)0x0) {
          *local_70 = *local_70 + Written;
        }
        Cursor = Cursor + fVar16 + Written;
        piVar19 = (int *)(local_38->SizeList)._Begin;
      }
    }
  }
  return eVar18;
}

Assistant:

static err_t RenderBlockData(matroska_block *Element, struct stream *Output, bool_t UNUSED_PARAM(bForceWithoutMandatory), bool_t UNUSED_PARAM(bWithDefault), int ForProfile, filepos_t *Rendered)
{
    err_t Err = ERR_NONE;
    uint8_t BlockHead[5], *Cursor;
    size_t ToWrite, Written, BlockHeadSize = 4;
    ebml_element *Elt, *Elt2, *Header = NULL;
    MatroskaTrackEncodingCompAlgo CompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
    MatroskaContentEncodingScope CompressionScope = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;
    assert(Element->Lacing != LACING_AUTO);

    if (Element->TrackNumber < 0x80)
    {
        BlockHead[0] = 0x80 | (Element->TrackNumber & 0xFF);
        Cursor = &BlockHead[1];
    }
    else if (Element->TrackNumber < 0x4000)
    {
        BlockHead[0] = 0x40 | (Element->TrackNumber >> 8);
        BlockHead[1] = Element->TrackNumber & 0xFF;
        Cursor = &BlockHead[2];
        BlockHeadSize = 5;
    }
    else
        return ERR_INVALID_DATA;

    STORE16BE(Cursor,Element->LocalTimestamp);
    Cursor += 2;

    *Cursor = 0;
    if (Element->Invisible)
        *Cursor |= 0x08;
    *Cursor |= Element->Lacing << 1;
    if (EBML_ElementIsType((ebml_element*)Element, MATROSKA_getContextSimpleBlock()))
    {
        if (Element->IsKeyframe)
            *Cursor |= 0x80;
        if (Element->IsDiscardable)
            *Cursor |= 0x01;
    }

    Err = Stream_Write(Output,BlockHead,BlockHeadSize,&Written);
    if (Err != ERR_NONE)
        goto failed;
    if (Written != BlockHeadSize)
    {
        Err = ERR_WRITE;
        goto failed;
    }
    if (Rendered)
        *Rendered = Written;

    assert(Element->WriteTrack!=NULL);
    Elt = EBML_MasterFindChild(Element->WriteTrack, MATROSKA_getContextContentEncodings());
    if (Elt)
    {
        Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncoding());
        if (EBML_MasterChildren(Elt))
        {
            if (EBML_MasterNext(Elt))
                return ERR_INVALID_DATA; // TODO support cascaded compression/encryption

            Elt2 = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncodingScope());
            if (Elt2)
                CompressionScope = EBML_IntegerValue((ebml_integer*)Elt2);

            Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompression());
            if (!Elt)
                return ERR_INVALID_DATA; // TODO: support encryption

            Header = EBML_MasterGetChild((ebml_master*)Elt, MATROSKA_getContextContentCompAlgo(),ForProfile);
            if (Header)
                CompressionAlgo = EBML_IntegerValue((ebml_integer*)Header);
            bool_t CanCompress = 0;
            if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                CanCompress = 1;
#if defined(CONFIG_ZLIB)
            else if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB)
                CanCompress = 1;
#endif
            if (!CanCompress)
            {
                Err = ERR_NOT_SUPPORTED;
                goto failed;
            }

            if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                Header = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompSettings());
        }
    }

#if !defined(CONFIG_ZLIB)
    if (Header && Header->Context==MATROSKA_getContextContentCompAlgo())
    {
        Err = ERR_NOT_SUPPORTED;
        goto failed;
    }
#endif

    if (Element->Lacing == LACING_AUTO)
        Element->Lacing = GetBestLacingType(Element, ForProfile);
    if (Element->Lacing != LACING_NONE)
    {
        uint8_t *LaceHead = malloc(1 + ARRAYCOUNT(Element->SizeList,int32_t)*4);
        size_t i,LaceSize = 1;
        int32_t DataSize, PrevSize;
        if (!LaceHead)
        {
            Err = ERR_OUT_OF_MEMORY;
            goto failed;
        }
        LaceHead[0] = (ARRAYCOUNT(Element->SizeList,int32_t)-1) & 0xFF; // number of elements in the lace
        if (Element->Lacing == LACING_EBML)
        {
            DataSize = (int32_t)GetBlockFrameSize(Element, 0, Header, CompressionAlgo, CompressionScope);
            LaceSize += EBML_CodedValueLength(DataSize,EBML_CodedSizeLength(DataSize,0,1),LaceHead+LaceSize, 1);
            for (i=1;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
            {
                PrevSize = DataSize;
                DataSize = (int32_t)GetBlockFrameSize(Element, i, Header, CompressionAlgo, CompressionScope);
                LaceSize += EBML_CodedValueLengthSigned(DataSize-PrevSize,EBML_CodedSizeLengthSigned(DataSize-PrevSize,0),LaceHead+LaceSize);
            }
        }
        else if (Element->Lacing == LACING_XIPH)
        {
            for (i=0;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
            {
                DataSize = (int32_t)GetBlockFrameSize(Element, i, Header, CompressionAlgo, CompressionScope);
                while (DataSize >= 0xFF)
                {
                    LaceHead[LaceSize++] = 0xFF;
                    DataSize -= 0xFF;
                }
                LaceHead[LaceSize++] = (uint8_t)DataSize;
            }
        }
        else if (Element->Lacing == LACING_FIXED)
        {
            // nothing to write
        }
        assert(LaceSize <= (1 + ARRAYCOUNT(Element->SizeList,int32_t)*4));
        Err = Stream_Write(Output,LaceHead,LaceSize,&Written);
        if (Err != ERR_NONE)
            goto failed;
        if (Rendered)
            *Rendered += Written;
        free(LaceHead);
    }
    Node_SET(Element,MATROSKA_BLOCK_READ_TRACK,&Element->WriteTrack); // now use the write track for consecutive read of the same element

    Cursor = ARRAYBEGIN(Element->Data,uint8_t);
    if (Header && (CompressionScope & MATROSKA_CONTENTENCODINGSCOPE_BLOCK))
    {
        int32_t* i;
        if (Header && Header->Context==MATROSKA_getContextContentCompAlgo())
        {
#if defined(CONFIG_ZLIB)
            if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB)
            {
                uint8_t *OutBuf;
                array TmpBuf;
                ArrayInit(&TmpBuf);
                for (i=ARRAYBEGIN(Element->SizeList,int32_t);i!=ARRAYEND(Element->SizeList,int32_t);++i)
                {
                    if (!ArrayResize(&TmpBuf,*i + 100,0))
                    {
                        ArrayClear(&TmpBuf);
                        Err = ERR_OUT_OF_MEMORY;
                        break;
                    }
                    OutBuf = ARRAYBEGIN(TmpBuf,uint8_t);
                    ToWrite = ARRAYCOUNT(TmpBuf,uint8_t);
                    if (CompressFrameZLib(Cursor, *i, &OutBuf, &ToWrite) != ERR_NONE)
                    {
                        ArrayClear(&TmpBuf);
                        Err = ERR_OUT_OF_MEMORY;
                        break;
                    }

                    Err = Stream_Write(Output,OutBuf,ToWrite,&Written);
                    ArrayClear(&TmpBuf);
                    if (Rendered)
                        *Rendered += Written;
                    Cursor += *i;
                    if (Err!=ERR_NONE)
                        break;
                }
            }
#endif
        }
        else
        {
            // header compression
            for (i=ARRAYBEGIN(Element->SizeList,int32_t);i!=ARRAYEND(Element->SizeList,int32_t);++i)
            {
                assert(memcmp(Cursor,ARRAYBEGIN(((ebml_binary*)Header)->Data,uint8_t),(size_t)EBML_ElementDataSize(Header, 1))==0);
                if (memcmp(Cursor,ARRAYBEGIN(((ebml_binary*)Header)->Data,uint8_t),(size_t)EBML_ElementDataSize(Header, 1))!=0)
                {
                    Err = ERR_INVALID_DATA;
                    goto failed;
                }
                Cursor += EBML_ElementDataSize(Header, 1);
                ToWrite = *i - (size_t)EBML_ElementDataSize(Header, 1);
                Err = Stream_Write(Output,Cursor,ToWrite,&Written);
                if (Rendered)
                    *Rendered += Written;
                Cursor += Written;
            }
        }
    }
    else
    {
        ToWrite = ARRAYCOUNT(Element->Data,uint8_t);
        Err = Stream_Write(Output,Cursor,ToWrite,&Written);
        if (Rendered)
            *Rendered += Written;
    }

failed:
    return Err;
}